

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O2

void BrotliStoreMetaBlockHeader(size_t len,int is_uncompressed,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lStack_10;
  
  uVar2 = *storage_ix;
  *(ulong *)(storage + (uVar2 >> 3)) = (ulong)storage[uVar2 >> 3];
  uVar3 = uVar2 + 1;
  *storage_ix = uVar3;
  uVar1 = uVar3 >> 3;
  if (len < 0x10001) {
    *(ulong *)(storage + uVar1) = (ulong)storage[uVar1];
    *storage_ix = uVar2 + 3;
    if (0xffff < len - 1) goto LAB_00127367;
    lStack_10 = 0x13;
  }
  else {
    *(ulong *)(storage + uVar1) = (ulong)storage[uVar1] | 1L << ((byte)uVar3 & 7);
    *storage_ix = uVar2 + 3;
    if (0x100000 < len) goto LAB_00127367;
    lStack_10 = 0x17;
  }
  uVar3 = uVar2 + 3 >> 3;
  *(size_t *)(storage + uVar3) = len - 1 << ((byte)(uVar2 + 3) & 7) | (ulong)storage[uVar3];
  uVar2 = uVar2 + lStack_10;
  *storage_ix = uVar2;
  if ((uint)is_uncompressed < 2) {
    *(ulong *)(storage + (uVar2 >> 3)) =
         (ulong)(uint)is_uncompressed << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
    *storage_ix = uVar2 + 1;
    return;
  }
LAB_00127367:
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

static void BrotliStoreMetaBlockHeader(
    size_t len, BROTLI_BOOL is_uncompressed, size_t* storage_ix,
    uint8_t* storage) {
  /* ISLAST */
  BrotliWriteBits(1, 0, storage_ix, storage);
  if (len <= (1U << 16)) {
    /* MNIBBLES is 4 */
    BrotliWriteBits(2, 0, storage_ix, storage);
    BrotliWriteBits(16, len - 1, storage_ix, storage);
  } else {
    /* MNIBBLES is 5 */
    BrotliWriteBits(2, 1, storage_ix, storage);
    BrotliWriteBits(20, len - 1, storage_ix, storage);
  }
  /* ISUNCOMPRESSED */
  BrotliWriteBits(1, (uint64_t)is_uncompressed, storage_ix, storage);
}